

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall
NetOptimize::replace_convolution_with_innerproduct_after_global_pooling(NetOptimize *this)

{
  int iVar1;
  Layer *pLVar2;
  int *piVar3;
  bool bVar4;
  Layer *pLVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong local_940;
  ParamDict pd;
  
  uVar6 = (long)(this->super_Net).layers.
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->super_Net).layers.
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  local_940 = 1;
  uVar8 = 0;
  do {
    if (uVar8 == uVar6) {
      return 0;
    }
    bVar4 = std::operator!=(&(this->super_Net).layers.
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar8]->type,"Pooling");
    if ((!bVar4) &&
       (pLVar5 = (this->super_Net).layers.
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8],
       *(int *)((long)&pLVar5[1].type._M_string_length + 4) != 0)) {
      iVar1 = *(pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar7 = local_940; uVar7 < uVar6; uVar7 = uVar7 + 1) {
        bVar4 = std::operator!=(&(this->super_Net).layers.
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar7]->type,"Convolution"
                               );
        if (((!bVar4) &&
            (pLVar2 = (this->super_Net).layers.
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar7],
            piVar3 = (pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            (long)(pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar3 == 4)) && (*piVar3 == iVar1)) {
          if (uVar6 != uVar7) {
            pLVar2 = (this->super_Net).layers.
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7];
            fprintf(_stderr,"replace_convolution_with_innerproduct_after_global_pooling %s %s\n",
                    (pLVar5->name)._M_dataplus._M_p,(pLVar2->name)._M_dataplus._M_p);
            pLVar5 = ncnn::create_layer("InnerProduct");
            std::__cxx11::string::assign((char *)&pLVar5->type);
            std::__cxx11::string::_M_assign((string *)&pLVar5->name);
            std::vector<int,_std::allocator<int>_>::operator=(&pLVar5->bottoms,&pLVar2->bottoms);
            std::vector<int,_std::allocator<int>_>::operator=(&pLVar5->tops,&pLVar2->tops);
            ncnn::ParamDict::ParamDict(&pd);
            (*pLVar5->_vptr_Layer[2])(pLVar5,&pd);
            *(undefined4 *)&pLVar5[1]._vptr_Layer = *(undefined4 *)&pLVar2[1]._vptr_Layer;
            *(undefined8 *)((long)&pLVar5[1]._vptr_Layer + 4) =
                 *(undefined8 *)((long)&pLVar2[1].type.field_2 + 8);
            *(undefined4 *)&pLVar5[1].support_bf16_storage =
                 *(undefined4 *)&pLVar2[1].name._M_dataplus._M_p;
            ncnn::Mat::operator=
                      ((Mat *)&pLVar5[1].bottoms,
                       (Mat *)&pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
            ncnn::Mat::operator=
                      ((Mat *)&pLVar5[1].bottom_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                       (Mat *)&pLVar2[2].one_blob_only);
            ncnn::Mat::operator=
                      ((Mat *)&pLVar5[2].type._M_string_length,(Mat *)&pLVar2[2].name.field_2);
            *(undefined4 *)
             &pLVar5[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                 *(undefined4 *)
                  &pLVar2[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                   ._M_impl.super__Vector_impl_data;
            pLVar5[1].typeindex = *(int *)((long)&pLVar2[1].name._M_dataplus._M_p + 4);
            ncnn::Mat::operator=((Mat *)&pLVar5[1].type,(Mat *)&pLVar2[1].name._M_string_length);
            (this->super_Net).layers.
            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7] = pLVar5;
            (*pLVar2->_vptr_Layer[1])(pLVar2);
            ncnn::ParamDict::~ParamDict(&pd);
          }
          break;
        }
      }
    }
    uVar8 = uVar8 + 1;
    local_940 = local_940 + 1;
  } while( true );
}

Assistant:

int NetOptimize::replace_convolution_with_innerproduct_after_global_pooling()
{
    const size_t layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "Pooling")
            continue;

        ncnn::Pooling* pooling = (ncnn::Pooling*)layers[i];
        if (pooling->global_pooling == 0)
            continue;

        // Pooling - Convolution
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "Convolution")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::Convolution* convolution = (ncnn::Convolution*)layers[j];

        fprintf(stderr, "replace_convolution_with_innerproduct_after_global_pooling %s %s\n", pooling->name.c_str(), convolution->name.c_str());

        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)ncnn::create_layer("InnerProduct");

        innerproduct->type = "InnerProduct";
        innerproduct->name = convolution->name;
        innerproduct->bottoms = convolution->bottoms;
        innerproduct->tops = convolution->tops;

        ncnn::ParamDict pd;
        innerproduct->load_param(pd);

        innerproduct->num_output = convolution->num_output;
        innerproduct->bias_term = convolution->bias_term;
        innerproduct->weight_data_size = convolution->weight_data_size;
        innerproduct->int8_scale_term = convolution->int8_scale_term;

        innerproduct->weight_data = convolution->weight_data;
        innerproduct->bias_data = convolution->bias_data;
        innerproduct->weight_data_int8_scales = convolution->weight_data_int8_scales;
        innerproduct->bottom_blob_int8_scale = convolution->bottom_blob_int8_scale;

        innerproduct->activation_type = convolution->activation_type;
        innerproduct->activation_params = convolution->activation_params;

        layers[j] = innerproduct;
        delete convolution;
    }

    return 0;
}